

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

void set_short_option_error_details
               (dropt_context *context,dropt_error err,dropt_char shortName,
               dropt_char *optionArgument)

{
  char_array optionName;
  dropt_char local_23 [3];
  dropt_char *pdStack_20;
  dropt_char shortNameBuf [3];
  dropt_char *optionArgument_local;
  dropt_char shortName_local;
  dropt_error err_local;
  dropt_context *context_local;
  
  local_23[0] = '-';
  local_23[1] = '?';
  local_23[2] = 0;
  pdStack_20 = optionArgument;
  if (context == (dropt_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0x241,
                  "void set_short_option_error_details(dropt_context *, dropt_error, dropt_char, const dropt_char *)"
                 );
  }
  if (shortName != '\0') {
    local_23[1] = shortName;
    local_23[0] = 0x2d;
    optionName = make_char_array(local_23,2);
    set_error_details(context,err,optionName,pdStack_20);
    return;
  }
  __assert_fail("shortName != DROPT_TEXT_LITERAL(\'\\0\')",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
                0x242,
                "void set_short_option_error_details(dropt_context *, dropt_error, dropt_char, const dropt_char *)"
               );
}

Assistant:

static void
set_short_option_error_details(dropt_context* context, dropt_error err,
                               dropt_char shortName,
                               const dropt_char* optionArgument)
{
    /* "-?" is just a placeholder. */
    dropt_char shortNameBuf[] = DROPT_TEXT_LITERAL("-?");

    assert(context != NULL);
    assert(shortName != DROPT_TEXT_LITERAL('\0'));

    shortNameBuf[1] = shortName;

    set_error_details(context, err,
                      make_char_array(shortNameBuf,
                                      ARRAY_LENGTH(shortNameBuf) - 1),
                      optionArgument);
}